

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
snappy::SnappyArrayWriter::TryFastAppend
          (SnappyArrayWriter *this,char *ip,size_t available,size_t len)

{
  char *dst;
  size_t space_left;
  char *op;
  size_t len_local;
  size_t available_local;
  char *ip_local;
  SnappyArrayWriter *this_local;
  
  dst = this->op_;
  if (((len < 0x11) && (0x14 < available)) && (0xf < (ulong)((long)this->op_limit_ - (long)dst))) {
    anon_unknown_48::UnalignedCopy128(ip,dst);
    this->op_ = dst + len;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t len) {
    char* op = op_;
    const size_t space_left = op_limit_ - op;
    if (len <= 16 && available >= 16 + kMaximumTagLength && space_left >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, op);
      op_ = op + len;
      return true;
    } else {
      return false;
    }
  }